

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfGetNamedBufferParameter
          (ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  GLuint not_a_buffer_name;
  GLuint GVar9;
  GLenum GVar10;
  GLenum *pGVar11;
  ulong uVar12;
  GLuint not_a_buffer_name_1;
  GLuint buffer;
  GLint value;
  GLubyte dummy_data [4];
  GLuint local_34;
  ulong local_30;
  undefined4 local_24;
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_34 = 0;
  local_24 = 0;
  (**(code **)(lVar8 + 0x3b8))(1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xe06);
  (*this->m_pNamedBufferStorage)(local_34,4,&local_24,0x42);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xe09);
  GVar9 = 0;
  do {
    GVar9 = GVar9 + 1;
    cVar1 = (**(code **)(lVar8 + 0xc68))(GVar9);
  } while (cVar1 != '\0');
  local_30 = local_30 & 0xffffffff00000000;
  (*this->m_pGetNamedBufferParameteriv)(GVar9,0x88bc,(GLint *)&local_30);
  bVar2 = ErrorCheckAndLog(this,"glGetNamedBufferParameteriv",0x502,
                           " if buffer is not the name of an existing buffer object.");
  GVar9 = 0;
  do {
    GVar9 = GVar9 + 1;
    cVar1 = (**(code **)(lVar8 + 0xc68))(GVar9);
  } while (cVar1 != '\0');
  local_30 = 0;
  (*this->m_pGetNamedBufferParameteri64v)(GVar9,0x88bc,(GLint64 *)&local_30);
  bVar3 = ErrorCheckAndLog(this,"glGetNamedBufferParameteri64v",0x502,
                           " if buffer is not the name of an existing buffer object.");
  local_30 = local_30 & 0xffffffff00000000;
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    uVar12 = 3;
    pGVar11 = TestErrorsOfGetNamedBufferParameter::valid_parameters + 2;
    do {
      if (pGVar11[-2] == GVar10) {
        pGVar11 = pGVar11 + -2;
        goto LAB_00a81c6b;
      }
      if (pGVar11[-1] == GVar10) {
        pGVar11 = pGVar11 + -1;
        goto LAB_00a81c6b;
      }
      if (*pGVar11 == GVar10) goto LAB_00a81c6b;
      if (pGVar11[1] == GVar10) {
        pGVar11 = pGVar11 + 1;
        goto LAB_00a81c6b;
      }
      uVar12 = uVar12 - 1;
      pGVar11 = pGVar11 + 4;
    } while (1 < uVar12);
    pGVar11 = TestErrorsOfGetNamedBufferParameter::valid_parameters + 8;
    if (GVar10 != 0x8765) break;
LAB_00a81c6b:
  } while (pGVar11 != TestErrorsOfGetNamedBufferParameter::valid_parameters + 9);
  (*this->m_pGetNamedBufferParameteriv)(local_34,GVar10,(GLint *)&local_30);
  bVar4 = ErrorCheckAndLog(this,"glGetNamedBufferParameteriv",0x500,
                           " if pname is not one of the buffer object parameter names: BUFFER_ACCESS, BUFFER_ACCESS_FLAGS, BUFFER_IMMUTABLE_STORAGE, BUFFER_MAPPED, BUFFER_MAP_LENGTH, BUFFER_MAP_OFFSET, BUFFER_SIZE, BUFFER_STORAGE_FLAGS, BUFFER_USAGE."
                          );
  local_30 = 0;
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    uVar12 = 3;
    pGVar11 = TestErrorsOfGetNamedBufferParameter()::valid_parameters + 2;
    do {
      if (pGVar11[-2] == GVar10) {
        pGVar11 = pGVar11 + -2;
        goto LAB_00a81d06;
      }
      if (pGVar11[-1] == GVar10) {
        pGVar11 = pGVar11 + -1;
        goto LAB_00a81d06;
      }
      if (*pGVar11 == GVar10) goto LAB_00a81d06;
      if (pGVar11[1] == GVar10) {
        pGVar11 = pGVar11 + 1;
        goto LAB_00a81d06;
      }
      uVar12 = uVar12 - 1;
      pGVar11 = pGVar11 + 4;
    } while (1 < uVar12);
    pGVar11 = TestErrorsOfGetNamedBufferParameter()::valid_parameters + 8;
    if (GVar10 != 0x8765) break;
LAB_00a81d06:
  } while (pGVar11 != TestErrorsOfGetNamedBufferParameter()::valid_parameters + 9);
  (*this->m_pGetNamedBufferParameteri64v)(local_34,GVar10,(GLint64 *)&local_30);
  bVar5 = ErrorCheckAndLog(this,"glGetNamedBufferParameteri64v",0x500,
                           " if pname is not one of the buffer object parameter names: BUFFER_ACCESS, BUFFER_ACCESS_FLAGS, BUFFER_IMMUTABLE_STORAGE, BUFFER_MAPPED, BUFFER_MAP_LENGTH, BUFFER_MAP_OFFSET, BUFFER_SIZE, BUFFER_STORAGE_FLAGS, BUFFER_USAGE."
                          );
  if (local_34 != 0) {
    (**(code **)(lVar8 + 0x438))(1,&local_34);
  }
  return ((bVar2 && bVar3) && bVar4) && bVar5;
}

Assistant:

bool ErrorsTest::TestErrorsOfGetNamedBufferParameter()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name in GetNamedBufferParameteriv function error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			glw::GLint value = 0;

			/* Test. */
			m_pGetNamedBufferParameteriv(not_a_buffer_name, GL_BUFFER_MAPPED, &value);

			is_ok &= ErrorCheckAndLog("glGetNamedBufferParameteriv", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid buffer name in GetNamedBufferParameteri64v function error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			glw::GLint64 value = 0;

			/* Test. */
			m_pGetNamedBufferParameteri64v(not_a_buffer_name, GL_BUFFER_MAPPED, &value);

			is_ok &= ErrorCheckAndLog("glGetNamedBufferParameteri64v", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid parameter name in GetNamedBufferParameteriv function error behavior. */
		{
			/* Prepare for invalid parameter name error behavior verification. */
			static const glw::GLenum valid_parameters[] = {
				GL_BUFFER_ACCESS, GL_BUFFER_ACCESS_FLAGS,  GL_BUFFER_IMMUTABLE_STORAGE,
				GL_BUFFER_MAPPED, GL_BUFFER_MAP_LENGTH,	GL_BUFFER_MAP_OFFSET,
				GL_BUFFER_SIZE,   GL_BUFFER_STORAGE_FLAGS, GL_BUFFER_USAGE,
				GL_NONE
			};
			static const glw::GLenum valid_parameters_last = sizeof(valid_parameters) / sizeof(valid_parameters[0]) - 1;

			glw::GLint value = 0;

			glw::GLenum invalid_parameter = 0;

			while (&valid_parameters[valid_parameters_last] !=
				   std::find(&valid_parameters[0], &valid_parameters[valid_parameters_last], (++invalid_parameter)))
				;

			/* Test. */
			m_pGetNamedBufferParameteriv(buffer, invalid_parameter, &value);

			is_ok &= ErrorCheckAndLog("glGetNamedBufferParameteriv", GL_INVALID_ENUM,
									  " if pname is not one of the buffer object parameter names: BUFFER_ACCESS,"
									  " BUFFER_ACCESS_FLAGS, BUFFER_IMMUTABLE_STORAGE, BUFFER_MAPPED,"
									  " BUFFER_MAP_LENGTH, BUFFER_MAP_OFFSET, BUFFER_SIZE, BUFFER_STORAGE_FLAGS,"
									  " BUFFER_USAGE.");
		}

		/* Test invalid parameter name in GetNamedBufferParameteri64v function error behavior. */
		{
			/* Prepare for invalid parameter name error behavior verification. */
			static const glw::GLenum valid_parameters[] = {
				GL_BUFFER_ACCESS, GL_BUFFER_ACCESS_FLAGS,  GL_BUFFER_IMMUTABLE_STORAGE,
				GL_BUFFER_MAPPED, GL_BUFFER_MAP_LENGTH,	GL_BUFFER_MAP_OFFSET,
				GL_BUFFER_SIZE,   GL_BUFFER_STORAGE_FLAGS, GL_BUFFER_USAGE,
				GL_NONE
			};
			static const glw::GLenum valid_parameters_last = sizeof(valid_parameters) / sizeof(valid_parameters[0]) - 1;

			glw::GLint64 value = 0;

			glw::GLenum invalid_parameter = 0;

			while (&valid_parameters[valid_parameters_last] !=
				   std::find(&valid_parameters[0], &valid_parameters[valid_parameters_last], (++invalid_parameter)))
				;

			/* Test. */
			m_pGetNamedBufferParameteri64v(buffer, invalid_parameter, &value);

			is_ok &= ErrorCheckAndLog("glGetNamedBufferParameteri64v", GL_INVALID_ENUM,
									  " if pname is not one of the buffer object parameter names: BUFFER_ACCESS,"
									  " BUFFER_ACCESS_FLAGS, BUFFER_IMMUTABLE_STORAGE, BUFFER_MAPPED,"
									  " BUFFER_MAP_LENGTH, BUFFER_MAP_OFFSET, BUFFER_SIZE, BUFFER_STORAGE_FLAGS,"
									  " BUFFER_USAGE.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}